

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::AssetPath> *value)

{
  bool bVar1;
  undefined1 local_68 [8];
  AssetPath v;
  optional<tinyusdz::value::AssetPath> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::AssetPath>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    tinyusdz::value::AssetPath::AssetPath((AssetPath *)local_68);
    this_local._7_1_ = ReadBasicType(this,(AssetPath *)local_68);
    if (this_local._7_1_) {
      nonstd::optional_lite::optional<tinyusdz::value::AssetPath>::operator=
                (value,(AssetPath *)local_68);
    }
    tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_68);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::AssetPath> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::AssetPath v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}